

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

global_m_map_t * __thiscall
tchecker::clockbounds::global_m_map_t::operator=(global_m_map_t *this,global_m_map_t *m)

{
  if (this != m) {
    if (this->_M != (map_t *)0x0) {
      operator_delete__(this->_M);
    }
    this->_clock_nb = 0;
    this->_M = (map_t *)0x0;
    this->_clock_nb = m->_clock_nb;
    this->_M = m->_M;
    m->_M = (map_t *)0x0;
    m->_clock_nb = 0;
  }
  return this;
}

Assistant:

tchecker::clockbounds::global_m_map_t & global_m_map_t::operator=(tchecker::clockbounds::global_m_map_t && m)
{
  if (this != &m) {
    clear();

    _clock_nb = std::move(m._clock_nb);
    _M = std::move(m._M);

    m._M = nullptr;
    m._clock_nb = 0;
  }
  return *this;
}